

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

bool __thiscall QDir::makeAbsolute(QDir *this)

{
  QAbstractFileEngine *pQVar1;
  _Head_base<0UL,_QDirPrivate_*,_false> _Var2;
  bool bVar3;
  QDirPrivate *pQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> dir;
  QString local_48;
  _Head_base<0UL,_QDirPrivate_*,_false> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (this->d_ptr).d.ptr;
  if ((pQVar4 != (QDirPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QDirPrivate>::detach_helper(&this->d_ptr);
  }
  pQVar4 = (this->d_ptr).d.ptr;
  local_30._M_head_impl = (QDirPrivate *)0x0;
  pQVar1 = (pQVar4->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (pQVar1 == (QAbstractFileEngine *)0x0) {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QDirPrivate::resolveAbsoluteEntry(&local_48,pQVar4);
    pQVar4 = (QDirPrivate *)operator_new(0x118);
    QDirPrivate::QDirPrivate(pQVar4,(this->d_ptr).d.ptr);
    _Var2._M_head_impl = local_30._M_head_impl;
    bVar3 = local_30._M_head_impl != (QDirPrivate *)0x0;
    local_30._M_head_impl = pQVar4;
    if (bVar3) {
      QDirPrivate::~QDirPrivate(_Var2._M_head_impl);
      operator_delete(_Var2._M_head_impl,0x118);
    }
    QDirPrivate::setPath(local_30._M_head_impl,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_00228910:
    _Var2._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (QDirPrivate *)0x0;
    QSharedDataPointer<QDirPrivate>::reset(&this->d_ptr,_Var2._M_head_impl);
    bVar3 = true;
  }
  else {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (*pQVar1->_vptr_QAbstractFileEngine[0x19])(&local_48,pQVar1,3);
    bVar3 = isRelativePath(&local_48);
    if (bVar3) {
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      pQVar4 = (QDirPrivate *)operator_new(0x118);
      QDirPrivate::QDirPrivate(pQVar4,(this->d_ptr).d.ptr);
      _Var2._M_head_impl = local_30._M_head_impl;
      bVar5 = local_30._M_head_impl != (QDirPrivate *)0x0;
      local_30._M_head_impl = pQVar4;
      if (bVar5) {
        QDirPrivate::~QDirPrivate(_Var2._M_head_impl);
        operator_delete(_Var2._M_head_impl,0x118);
      }
      QDirPrivate::setPath(local_30._M_head_impl,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (!bVar3) goto LAB_00228910;
    }
    bVar3 = false;
  }
  std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::~unique_ptr
            ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::makeAbsolute()
{
    Q_D(const QDir);
    std::unique_ptr<QDirPrivate> dir;
    if (!!d->fileEngine) {
        QString absolutePath = d->fileEngine->fileName(QAbstractFileEngine::AbsoluteName);
        if (QDir::isRelativePath(absolutePath))
            return false;

        dir.reset(new QDirPrivate(*d_ptr.constData()));
        dir->setPath(absolutePath);
    } else { // native FS
        QString absoluteFilePath = d->resolveAbsoluteEntry();
        dir.reset(new QDirPrivate(*d_ptr.constData()));
        dir->setPath(absoluteFilePath);
    }
    d_ptr = dir.release(); // actually detach
    return true;
}